

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelInstance.cpp
# Opt level: O1

void __thiscall ModelInstance::transition(ModelInstance *this,float x)

{
  int iVar1;
  iterator iVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  uint uVar6;
  bool bVar7;
  float fVar8;
  array<float,_36UL> cumulative;
  float local_c0 [36];
  
  uVar5 = (ulong)this->state;
  if (uVar5 < 0x24) {
    fVar8 = 0.0;
    lVar4 = -0x90;
    do {
      fVar8 = fVar8 + *(float *)((long)(this->network).transitions._M_elems[uVar5 + 1]._M_elems +
                                lVar4);
      lVar4 = lVar4 + 4;
    } while (lVar4 != 0);
    if ((fVar8 != 0.0) || (NAN(fVar8))) {
      lVar4 = 0;
      memset(local_c0,0,0x90);
      fVar8 = (this->network).transitions._M_elems[uVar5]._M_elems[0];
      local_c0[0] = fVar8;
      do {
        fVar8 = fVar8 + *(float *)((long)(this->network).transitions._M_elems[uVar5]._M_elems +
                                  lVar4 + 4);
        *(float *)((long)local_c0 + lVar4 + 4) = fVar8;
        lVar4 = lVar4 + 4;
      } while (lVar4 != 0x8c);
      uVar6 = 0;
      lVar4 = 0;
      do {
        fVar8 = *(float *)((long)local_c0 + lVar4);
        if (fVar8 <= x) {
          uVar6 = uVar6 + 1;
        }
        else {
          iVar1 = this->state;
          if ((5 < iVar1 - 6U || uVar6 != iVar1 + 6U) &&
             (iVar3 = iVar1 % 6, iVar1 + 1U != uVar6 || iVar3 != 1)) {
            if (uVar6 == iVar1 - iVar3 && 1 < iVar3) {
              iVar2._M_current =
                   (this->dimersactive)._M_elems[0].
                   super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
                   ._M_finish;
              if (iVar2._M_current ==
                  (this->dimersactive)._M_elems[0].super__Vector_base<float,_std::allocator<float>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                          ((vector<float,std::allocator<float>> *)&this->dimersactive,iVar2,
                           &this->currenttime);
              }
              else {
                *iVar2._M_current = this->currenttime;
                (this->dimersactive)._M_elems[0].super__Vector_base<float,_std::allocator<float>_>.
                _M_impl.super__Vector_impl_data._M_finish = iVar2._M_current + 1;
              }
            }
            if ((0xb < this->state) && (uVar6 == (uint)this->state % 6)) {
              iVar2._M_current =
                   (this->dimersactive)._M_elems[1].
                   super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
                   ._M_finish;
              if (iVar2._M_current ==
                  (this->dimersactive)._M_elems[1].super__Vector_base<float,_std::allocator<float>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                          ((vector<float,std::allocator<float>> *)
                           ((this->dimersactive)._M_elems + 1),iVar2,&this->currenttime);
              }
              else {
                *iVar2._M_current = this->currenttime;
                (this->dimersactive)._M_elems[1].super__Vector_base<float,_std::allocator<float>_>.
                _M_impl.super__Vector_impl_data._M_finish = iVar2._M_current + 1;
              }
            }
            this->state = uVar6;
            updateStep(this);
          }
        }
      } while ((fVar8 <= x) && (bVar7 = lVar4 != 0x8c, lVar4 = lVar4 + 4, bVar7));
    }
    return;
  }
  std::__throw_out_of_range_fmt("array::at: __n (which is %zu) >= _Nm (which is %zu)",uVar5,0x24);
}

Assistant:

void ModelInstance::transition(float x) {
	// No outgoing edges, then stay in this state
	if (std::accumulate(network.transitions.at(state).begin(), network.transitions.at(state).end(), 0.0) == 0){
		return;
	}

	// Iterate over outgoing edges, find the one to take depending on the random number x
	std::array<float, 36> cumulative{};
	std::partial_sum(network.transitions.at(state).begin(), network.transitions.at(state).end(), cumulative.begin());
	int index = 0;
	for (float threshold : cumulative){
		if (x < threshold){
			//It is not one of transitions where S is activated
			bool activatingS = (state / 6 == 1 && index == state + 6) ||
							   (state % 6 == 1 && index == state + 1);
			if (!activatingS){
				if (state % 6 >= 2 && index == state - (state % 6)) {
					dimersactive.at(0).push_back(currenttime);
					//std::cout << "inactivate complex 1" << std::endl;
				}
				if (state / 6 >= 2 && index == state % 6) {
					dimersactive.at(1).push_back(currenttime);
					//std::cout << "inactivate complex 2" << std::endl;
				}
				// if not adding Si, position does not matter, else make sure it is close enough or do nothing
				state = index;
				updateStep();
			}
			break;
		}
		index++;
	}
}